

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O3

void pele::physics::turbinflow::TurbInflow::fill_turb_plane
               (TurbParm *a_tp,Vector<double,_std::allocator<double>_> *x,
               Vector<double,_std::allocator<double>_> *y,Real z,FArrayBox *v)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  pointer pdVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  int iVar18;
  double *pdVar19;
  undefined4 extraout_EDX;
  undefined4 uVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  size_type a_capacity;
  undefined1 *puVar27;
  long lVar28;
  long lVar29;
  pointer pdVar30;
  ulong a_capacity_00;
  long lVar31;
  bool bVar32;
  int iVar33;
  int iVar34;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar35;
  double dVar36;
  double dVar37;
  DeviceVector<amrex::Real> y_dev;
  DeviceVector<amrex::Real> x_dev;
  Real ydata [3];
  long local_210;
  PODVector<double,_std::allocator<double>_> local_1b8;
  PODVector<double,_std::allocator<double>_> local_198;
  undefined1 local_178 [16];
  long local_160;
  double *local_158;
  ulong local_150;
  long local_148;
  double *local_140;
  ulong local_138;
  double *local_130;
  long local_128;
  double local_120;
  double local_118;
  long local_110;
  pointer local_108;
  long local_100;
  double *local_f8;
  pointer local_f0;
  long local_e8;
  long local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  double local_c8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined1 local_78 [16];
  double local_68 [7];
  
  local_178._8_8_ = local_178._0_8_;
  dVar35 = (a_tp->dx).arr[2];
  if ((z < dVar35 * 0.5 + a_tp->szlo) || (dVar35 * -0.5 + a_tp->szhi < z)) {
    read_turb_planes(a_tp,z);
  }
  local_178._0_8_ = a_tp;
  local_158 = (v->super_BaseFab<double>).dptr;
  iVar2 = (v->super_BaseFab<double>).domain.smallend.vect[0];
  iVar3 = (v->super_BaseFab<double>).domain.smallend.vect[1];
  iVar4 = (v->super_BaseFab<double>).domain.smallend.vect[2];
  iVar5 = (v->super_BaseFab<double>).domain.bigend.vect[0];
  iVar6 = (v->super_BaseFab<double>).domain.bigend.vect[1];
  iVar18 = (v->super_BaseFab<double>).domain.bigend.vect[2];
  uVar23 = (long)(x->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(x->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start >> 3;
  local_198.m_data = (pointer)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  a_capacity_00 = 8;
  a_capacity = 8;
  if (8 < uVar23) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar23);
  }
  amrex::PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_198,a_capacity);
  uVar24 = (long)(y->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(y->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start >> 3;
  local_1b8.m_data = (pointer)0x0;
  local_1b8.m_size = 0;
  local_1b8.m_capacity = 0;
  if (8 < uVar24) {
    a_capacity_00 = 8;
    do {
      a_capacity_00 = a_capacity_00 * 3 + 1 >> 1;
    } while (a_capacity_00 < uVar24);
  }
  local_198.m_size = uVar23;
  amrex::PODVector<double,_std::allocator<double>_>::AllocateBuffer(&local_1b8,a_capacity_00);
  pdVar13 = (x->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  sVar21 = (long)(x->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar13;
  local_1b8.m_size = uVar24;
  if (sVar21 != 0) {
    memcpy(local_198.m_data,pdVar13,sVar21);
  }
  pdVar13 = (y->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  sVar21 = (long)(y->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish - (long)pdVar13;
  uVar17 = local_178._0_8_;
  if (sVar21 != 0) {
    memcpy(local_1b8.m_data,pdVar13,sVar21);
  }
  pdVar30 = local_198.m_data;
  local_d8 = *(undefined4 *)(uVar17 + 0xd0);
  uStack_d4 = *(uint *)(uVar17 + 0xd4);
  uStack_cc = 0;
  if (*(int *)(uVar17 + 0x94) == 1) {
    uStack_cc = 0x80000000;
    uStack_d4 = uStack_d4 ^ 0x80000000;
  }
  uStack_d0 = 0;
  iVar7 = (v->super_BaseFab<double>).domain.smallend.vect[2];
  iVar8 = (v->super_BaseFab<double>).domain.bigend.vect[2];
  if (iVar7 <= iVar8) {
    local_148 = (long)((iVar5 - iVar2) + 1);
    local_160 = ((iVar6 - iVar3) + 1) * local_148;
    local_100 = ((iVar18 - iVar4) + 1) * local_160;
    lVar22 = *(long *)(uVar17 + 0xa8);
    lVar14 = *(long *)(lVar22 + 0x10);
    iVar5 = *(int *)(lVar22 + 0x18);
    iVar6 = *(int *)(lVar22 + 0x1c);
    iVar18 = *(int *)(lVar22 + 0x20);
    lVar31 = (long)((*(int *)(lVar22 + 0x24) - iVar5) + 1);
    lVar25 = ((*(int *)(lVar22 + 0x28) - iVar6) + 1) * lVar31;
    local_110 = ((*(int *)(lVar22 + 0x2c) - iVar18) + 1) * lVar25;
    local_88 = *(double *)(uVar17 + 0x30);
    dStack_80 = *(double *)(uVar17 + 0x38);
    local_98 = *(double *)(uVar17 + 0x60);
    dStack_90 = *(double *)(uVar17 + 0x68);
    local_a8 = *(undefined8 *)(uVar17 + 0x20);
    uStack_a0 = 0;
    iVar9 = (v->super_BaseFab<double>).domain.smallend.vect[1];
    iVar10 = (v->super_BaseFab<double>).domain.smallend.vect[0];
    dVar35 = (z - *(double *)(uVar17 + 0xb0)) * *(double *)(uVar17 + 0x70);
    uVar11 = (v->super_BaseFab<double>).domain.bigend.vect[0];
    local_138 = (ulong)uVar11;
    uVar12 = (v->super_BaseFab<double>).domain.bigend.vect[1];
    local_150 = (ulong)uVar12;
    local_f0 = local_1b8.m_data;
    dVar36 = round(dVar35);
    dVar35 = dVar35 - (double)(int)dVar36;
    local_120 = (2.0 - dVar35) * dVar35;
    local_118 = (dVar35 + -2.0) * (dVar35 + -1.0) * 0.5;
    iVar18 = (int)dVar36 - iVar18;
    local_108 = pdVar30;
    do {
      if (iVar9 <= (int)local_150) {
        local_140 = local_158 + (iVar7 - iVar4) * local_160;
        local_210 = (long)iVar9;
        do {
          if (iVar10 <= (int)local_138) {
            local_e8 = local_210 - iVar9;
            local_130 = local_140 + (local_210 - iVar3) * local_148;
            lVar22 = (long)iVar10;
            do {
              local_e0 = lVar22 - iVar10;
              local_f8 = local_130 + (lVar22 - iVar2);
              lVar26 = 0;
              local_128 = lVar22;
              do {
                dVar36 = (pdVar30[local_e0] - local_88) * local_98;
                dVar37 = (local_f0[local_e8] - dStack_80) * dStack_90;
                auVar15._8_4_ = SUB84(dVar37,0);
                auVar15._0_8_ = dVar36;
                auVar15._12_4_ = (int)((ulong)dVar37 >> 0x20);
                dVar37 = round(dVar36);
                local_178._8_4_ = extraout_XMM0_Dc;
                local_178._0_8_ = dVar37;
                local_178._12_4_ = extraout_XMM0_Dd;
                dVar37 = round(auVar15._8_8_);
                iVar33 = (int)(double)local_178._0_8_;
                iVar34 = (int)dVar37;
                if (-1 < iVar33) {
                  auVar16._4_4_ = -(uint)(iVar33 < (int)local_a8);
                  auVar16._0_4_ = -(uint)(iVar33 < (int)local_a8);
                  auVar16._8_4_ = -(uint)(iVar34 < local_a8._4_4_);
                  auVar16._12_4_ = -(uint)(iVar34 < local_a8._4_4_);
                  uVar20 = movmskpd(extraout_EDX,auVar16);
                  if ((byte)(-1 < iVar34 & (byte)uVar20 & (byte)uVar20 >> 1) == 1) {
                    dVar36 = dVar36 - (double)iVar33;
                    dVar37 = auVar15._8_8_ - (double)iVar34;
                    lVar22 = local_110 * lVar26;
                    puVar27 = local_78;
                    lVar28 = 0;
                    do {
                      lVar29 = 0;
                      do {
                        lVar1 = lVar14 + (long)((iVar33 - iVar5) + 2 + (int)lVar28) * 8 +
                                (iVar34 + (2 - iVar6) + (int)lVar29) * lVar31 * 8;
                        *(double *)(puVar27 + lVar29 * 8) =
                             *(double *)(lVar1 + (iVar18 + 2) * lVar25 * 8 + lVar22 * 8) *
                             dVar35 * 0.5 * (dVar35 + -1.0) +
                             *(double *)(lVar1 + lVar25 * iVar18 * 8 + lVar22 * 8) * local_118 +
                             *(double *)(lVar1 + (iVar18 + 1) * lVar25 * 8 + lVar22 * 8) * local_120
                        ;
                        lVar29 = lVar29 + 1;
                      } while (lVar29 != 3);
                      lVar28 = lVar28 + 1;
                      puVar27 = puVar27 + 0x18;
                    } while (lVar28 != 3);
                    pdVar19 = local_68;
                    lVar22 = 0;
                    do {
                      local_c8[lVar22] =
                           *pdVar19 * dVar37 * 0.5 * (dVar37 + -1.0) +
                           pdVar19[-2] * (dVar37 + -2.0) * (dVar37 + -1.0) * 0.5 +
                           pdVar19[-1] * (2.0 - dVar37) * dVar37;
                      lVar22 = lVar22 + 1;
                      pdVar19 = pdVar19 + 3;
                    } while (lVar22 != 3);
                    local_f8[local_100 * lVar26] =
                         (dVar36 * 0.5 * (dVar36 + -1.0) * local_c8[2] +
                         (dVar36 + -2.0) * (dVar36 + -1.0) * 0.5 * local_c8[0] +
                         (2.0 - dVar36) * dVar36 * local_c8[1]) *
                         (double)CONCAT44(uStack_d4,local_d8);
                    pdVar30 = local_108;
                  }
                }
                lVar26 = lVar26 + 1;
              } while (lVar26 != 3);
              lVar22 = local_128 + 1;
            } while (uVar11 + 1 != (int)lVar22);
          }
          local_210 = local_210 + 1;
        } while (uVar12 + 1 != (int)local_210);
      }
      bVar32 = iVar7 != iVar8;
      iVar7 = iVar7 + 1;
    } while (bVar32);
  }
  amrex::Gpu::Device::synchronize();
  if (local_1b8.m_data != (pointer)0x0) {
    operator_delete(local_1b8.m_data,local_1b8.m_capacity << 3);
  }
  if (local_198.m_data != (pointer)0x0) {
    operator_delete(local_198.m_data,local_198.m_capacity << 3);
  }
  return;
}

Assistant:

void
TurbInflow::fill_turb_plane(
  TurbParm& a_tp,
  const amrex::Vector<amrex::Real>& x,
  const amrex::Vector<amrex::Real>& y,
  amrex::Real z,
  amrex::FArrayBox& v)
{
  if (
    (z < a_tp.szlo + 0.5 * a_tp.dx[2]) || (z > a_tp.szhi - 0.5 * a_tp.dx[2])) {
#if 0
    {
      amrex::AllPrint() << "Reading new data because z " << z << " is outside " << a_tp.szlo + 0.5 * a_tp.dx[2] << " and "
                     << a_tp.szhi - 0.5 * a_tp.dx[2] << std::endl;
    }
#endif
    read_turb_planes(a_tp, z);
  }

  const auto& bx = v.box();
  const auto& vd = v.array();

  amrex::Gpu::DeviceVector<amrex::Real> x_dev(x.size());
  amrex::Gpu::DeviceVector<amrex::Real> y_dev(y.size());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, x.begin(), x.end(), x_dev.begin());
  amrex::Gpu::copyAsync(
    amrex::Gpu::hostToDevice, y.begin(), y.end(), y_dev.begin());
  amrex::Real* xd = x_dev.data();
  amrex::Real* yd = y_dev.data();

  amrex::Real velScale = (a_tp.side == amrex::Orientation::high)
                           ? -a_tp.turb_scale_vel
                           : a_tp.turb_scale_vel;
  const auto& npboxcells = a_tp.npboxcells;
  const auto& pboxlo = a_tp.pboxlo;
  const auto& szlo = a_tp.szlo;
  const auto& dxinv = a_tp.dxinv;
  const auto& sd = a_tp.sdata->array();

  amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    amrex::Real cx[3], cy[3], cz[3], ydata[3];
    amrex::Real zdata[3][3];

    amrex::Real zz =
      (z - szlo) * dxinv[2];        // How many dz away from the left side ?
    int k0 = (int)(std::round(zz)); // What's the closest point ?
    zz -= amrex::Real(k0);
    cz[0] = 0.5 * (zz - 1.0) * (zz - 2.0); // Weight of k0 - 1
    cz[1] = zz * (2.0 - zz);               // Weight of k0
    cz[2] = 0.5 * zz * (zz - 1.0);         // Weight of k0 + 1
    k0 += 1;                               // Index starting at 1

    for (int n = 0; n < AMREX_SPACEDIM; ++n) {
      amrex::Real xx = (xd[i - bx.smallEnd(0)] - pboxlo[0]) * dxinv[0];
      amrex::Real yy = (yd[j - bx.smallEnd(1)] - pboxlo[1]) * dxinv[1];
      int i0 = (int)(std::round(xx));
      int j0 = (int)(std::round(yy));
      xx -= amrex::Real(i0);
      yy -= amrex::Real(j0);
      cx[0] = 0.5 * (xx - 1.0) * (xx - 2.0);
      cy[0] = 0.5 * (yy - 1.0) * (yy - 2.0);
      cx[1] = xx * (2.0 - xx);
      cy[1] = yy * (2.0 - yy);
      cx[2] = 0.5 * xx * (xx - 1.0);
      cy[2] = 0.5 * yy * (yy - 1.0);

      if (i0 >= 0 && i0 < npboxcells[0] && j0 >= 0 && j0 < npboxcells[1]) {
        i0 += 2;
        j0 += 2;
        for (int ii = 0; ii <= 2; ++ii) {
          for (int jj = 0; jj <= 2; ++jj) {
            zdata[ii][jj] = cz[0] * sd(i0 + ii, j0 + jj, k0 - 1, n) +
                            cz[1] * sd(i0 + ii, j0 + jj, k0, n) +
                            cz[2] * sd(i0 + ii, j0 + jj, k0 + 1, n);
          }
        }
        for (int ii = 0; ii <= 2; ++ii) {
          ydata[ii] =
            cy[0] * zdata[ii][0] + cy[1] * zdata[ii][1] + cy[2] * zdata[ii][2];
        }
        vd(i, j, k, n) = cx[0] * ydata[0] + cx[1] * ydata[1] + cx[2] * ydata[2];
        vd(i, j, k, n) *= velScale;
      }
    }
  });
  amrex::Gpu::synchronize(); // Ensure that DeviceVector's don't leave scope
                             // early
}